

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_foreach_macro.cpp
# Opt level: O1

void write_count(ostream *out,int max_count)

{
  undefined8 in_RAX;
  ostream *poVar1;
  int iVar2;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"\n/** Count the number of elements in the given __VA_ARGS__ */\n",0x3e);
  std::__ostream_insert<char,std::char_traits<char>>(out,"#define ",8);
  std::__ostream_insert<char,std::char_traits<char>>(out,"MSERIALIZE_",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(out,"COUNT(...) ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(out,"MSERIALIZE_",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(out,"EXPAND(",7);
  std::__ostream_insert<char,std::char_traits<char>>(out,"MSERIALIZE_",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(out,"COUNT_I(__VA_ARGS__",0x13);
  if (max_count != 0) {
    iVar2 = max_count;
    do {
      uStack_38._0_6_ = CONCAT15(0x2c,(undefined5)uStack_38);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(char *)((long)&uStack_38 + 5),1);
      std::ostream::operator<<((ostream *)poVar1,iVar2);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,",x))\n",5);
  std::__ostream_insert<char,std::char_traits<char>>(out,"#define ",8);
  std::__ostream_insert<char,std::char_traits<char>>(out,"MSERIALIZE_",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(out,"COUNT_I(",8);
  if (-1 < max_count) {
    iVar2 = 0;
    do {
      uStack_38._0_7_ = CONCAT16(0x61,(undefined6)uStack_38);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(char *)((long)&uStack_38 + 6),1);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,iVar2);
      uStack_38 = CONCAT17(0x2c,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_38 + 7),1);
      iVar2 = iVar2 + 1;
    } while (max_count + 1 != iVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"...) a",6);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)out,max_count);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void write_count(std::ostream& out, int max_count)
{
  out << "\n/** Count the number of elements in the given __VA_ARGS__ */\n"
      << "#define " << prefix << "COUNT(...) " << prefix << "EXPAND(" << prefix << "COUNT_I(__VA_ARGS__";
  for (int i = max_count; i != 0; --i)
  {
    out << ',' << i;
  }
  out << ",x))\n"
      << "#define " << prefix << "COUNT_I(";
  for (int i = 0; i < max_count+1; ++i)
  {
    out << 'a' << i << ',';
  }
  out << "...) a" << max_count << "\n";
}